

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

limits * nuraft::raft_server::get_raft_limits(void)

{
  limits *in_RDI;
  
  limits::operator=(in_RDI,(limits *)&raft_limits_);
  return in_RDI;
}

Assistant:

raft_server::limits raft_server::get_raft_limits() {
    return raft_limits_;
}